

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_mnist.hpp
# Opt level: O0

void pico_tree::read_mnist_images
               (string *filename,
               vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
               *images)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  runtime_error *prVar5;
  stream_wrapper *this;
  vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_> *in_RSI;
  header header;
  big_endian<int> magic_number;
  stream_wrapper wrapper;
  fstream stream;
  header *in_stack_fffffffffffffd68;
  stream_wrapper *in_stack_fffffffffffffd70;
  vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
  *in_stack_fffffffffffffd90;
  openmode in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  stream_wrapper local_228;
  iostream local_220 [528];
  vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_> *local_10;
  
  local_10 = in_RSI;
  std::operator|(_S_in,_S_bin);
  internal::open_stream
            ((string *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb4);
  internal::stream_wrapper::stream_wrapper(&local_228,local_220);
  internal::stream_wrapper::read<pico_tree::internal::big_endian<int>>
            (in_stack_fffffffffffffd70,(big_endian<int> *)in_stack_fffffffffffffd68);
  iVar1 = internal::big_endian<int>::operator()((big_endian<int> *)0x104c35);
  if (iVar1 != 0x803) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar5,"expected mnist images signature");
    __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  internal::stream_wrapper::read<pico_tree::internal::mnist_images::header>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  iVar2 = internal::big_endian::operator_cast_to_int((big_endian<int> *)0x104cd9);
  iVar3 = internal::big_endian::operator_cast_to_int((big_endian<int> *)0x104cf9);
  iVar1 = iVar3;
  iVar4 = internal::big_endian::operator_cast_to_int((big_endian<int> *)0x104d19);
  if (iVar3 * iVar4 != 0x310) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar5,"unexpected mnist image dimensions");
    __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  std::vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::resize
            (in_stack_fffffffffffffd90,CONCAT44(iVar2,iVar1));
  this = (stream_wrapper *)
         std::vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::
         size(local_10);
  std::vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::data
            ((vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_> *
             )0x104dc4);
  internal::stream_wrapper::read<std::array<std::byte,784ul>>
            (this,(size_t)in_stack_fffffffffffffd68,(array<std::byte,_784UL> *)0x104dd6);
  ::std::fstream::~fstream(local_220);
  return;
}

Assistant:

inline void read_mnist_images(
    std::string const& filename,
    std::vector<std::array<std::byte, 28 * 28>>& images) {
  using namespace internal;

  std::fstream stream = open_stream(filename, std::ios::in | std::ios::binary);
  stream_wrapper wrapper(stream);

  big_endian<std::int32_t> magic_number;
  wrapper.read(magic_number);
  if (magic_number() != mnist_images::header::magic_number) {
    throw std::runtime_error("expected mnist images signature");
  }

  mnist_images::header header;
  wrapper.read(header);
  header.image_count = big_endian<std::int32_t>{header.image_count};
  header.image_width = big_endian<std::int32_t>{header.image_width};
  header.image_height = big_endian<std::int32_t>{header.image_height};

  if (header.image_width * header.image_height != 28 * 28) {
    throw std::runtime_error("unexpected mnist image dimensions");
  }

  images.resize(static_cast<std::size_t>(header.image_count));
  wrapper.read(images.size(), images.data());
}